

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::checkPlausibility
          (Validity *__return_storage_ptr__,CompilerMain *this,Format format,
          ArrayPtr<const_unsigned_char> prefix)

{
  Format FVar1;
  size_t sVar2;
  Plausibility PVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  ProcessContext *pPVar8;
  char (*in_stack_ffffffffffffff58) [94];
  String local_98;
  Validity *local_78;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  PVar3 = isPlausibly(this,format,prefix);
  local_78 = __return_storage_ptr__;
  switch(PVar3) {
  case IMPOSSIBLE:
    lVar6 = 0;
    do {
      FVar1 = *(Format *)((long)&DAT_00203c40 + lVar6);
      PVar3 = isPlausibly(this,FVar1,prefix);
      if ((PVar3 & ~IMPLAUSIBLE) == WRONG_TYPE) {
        local_70 = (ArrayPtr<const_char>)toString(this,format);
        local_60 = (ArrayPtr<const_char>)toString(this,FVar1);
        kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[35],kj::StringPtr,char_const(&)[28]>
                  (&local_98,(kj *)"The input is not in \"",(char (*) [22])&local_70,
                   (StringPtr *)"\" format. It looks like it is in \"",(char (*) [35])&local_60,
                   (StringPtr *)"\" format. Try that instead.",
                   (char (*) [28])in_stack_ffffffffffffff58);
        (local_78->errorMessage).ptr.isSet = true;
        (local_78->errorMessage).ptr.field_1.value.content.ptr = local_98.content.ptr;
        (local_78->errorMessage).ptr.field_1.value.content.size_ = local_98.content.size_;
        goto LAB_0011eca1;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    local_70 = (ArrayPtr<const_char>)toString(this,format);
    kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[10]>
              (&local_98,(kj *)"The input is not in \"",(char (*) [22])&local_70,
               (StringPtr *)"\" format.",(char (*) [10])&local_70);
    (local_78->errorMessage).ptr.isSet = true;
    (local_78->errorMessage).ptr.field_1.value.content.ptr = local_98.content.ptr;
    (local_78->errorMessage).ptr.field_1.value.content.size_ = local_98.content.size_;
LAB_0011eca1:
    (local_78->errorMessage).ptr.field_1.value.content.disposer = local_98.content.disposer;
    return local_78;
  case IMPLAUSIBLE:
    lVar6 = 0;
    do {
      FVar1 = *(Format *)((long)&DAT_00203c40 + lVar6);
      PVar3 = isPlausibly(this,FVar1,prefix);
      if ((PVar3 & ~IMPLAUSIBLE) == WRONG_TYPE) {
        pPVar8 = this->context;
        local_70 = (ArrayPtr<const_char>)toString(this,format);
        local_60 = (ArrayPtr<const_char>)toString(this,FVar1);
        local_50 = (ArrayPtr<const_char>)toString(this,format);
        __return_storage_ptr__ = local_78;
        local_40 = (ArrayPtr<const_char>)toString(this,format);
        kj::
        str<char_const(&)[58],kj::StringPtr,char_const(&)[39],kj::StringPtr,char_const(&)[36],kj::StringPtr,char_const(&)[57],kj::StringPtr,char_const(&)[70]>
                  (&local_98,(kj *)"*** WARNING ***\nThe input data does not appear to be in \"",
                   (char (*) [58])&local_70,(StringPtr *)"\" format. It\nlooks like it may be in \""
                   ,(char (*) [39])&local_60,(StringPtr *)"\" format. I\'ll try to parse\nit in \"",
                   (char (*) [36])&local_50,
                   (StringPtr *)"\" format as you requested, but if it doesn\'t work,\ntry \"",
                   (char (*) [57])&local_40,
                   (StringPtr *)
                   "\" instead. Use --quiet to suppress this warning.\n*** END WARNING ***\n",
                   (char (*) [70])in_stack_ffffffffffffff58);
        pcVar7 = local_98.content.ptr;
        if (local_98.content.size_ == 0) {
          pcVar7 = "";
        }
        (*pPVar8->_vptr_ProcessContext[2])
                  (pPVar8,pcVar7,local_98.content.size_ + (local_98.content.size_ == 0));
        sVar2 = local_98.content.size_;
        pcVar7 = local_98.content.ptr;
        if (local_98.content.ptr != (char *)0x0) {
          local_98.content.ptr = (char *)0x0;
          local_98.content.size_ = 0;
          (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                    (local_98.content.disposer,pcVar7,1,sVar2,sVar2,0);
        }
        goto switchD_0011e9eb_caseD_3;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    pPVar8 = this->context;
    local_70 = (ArrayPtr<const_char>)toString(this,format);
    local_60 = (ArrayPtr<const_char>)toString(this,format);
    kj::str<char_const(&)[58],kj::StringPtr,char_const(&)[67],kj::StringPtr,char_const(&)[94]>
              (&local_98,(kj *)"*** WARNING ***\nThe input data does not appear to be in \"",
               (char (*) [58])&local_70,
               (StringPtr *)"\" format, nor\nin any other known format. I\'ll try to parse it in \""
               ,(char (*) [67])&local_60,
               (StringPtr *)
               "\"\nformat anyway, as you requested. Use --quiet to suppress this warning.\n*** END WARNING ***\n"
               ,in_stack_ffffffffffffff58);
    __return_storage_ptr__ = local_78;
    pcVar7 = local_98.content.ptr;
    if (local_98.content.size_ == 0) {
      pcVar7 = "";
    }
    (*pPVar8->_vptr_ProcessContext[2])
              (pPVar8,pcVar7,local_98.content.size_ + (local_98.content.size_ == 0));
    sVar2 = local_98.content.size_;
    pcVar7 = local_98.content.ptr;
    if (local_98.content.ptr != (char *)0x0) {
      local_98.content.ptr = (char *)0x0;
      local_98.content.size_ = 0;
      (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                (local_98.content.disposer,pcVar7,1,sVar2,sVar2,0);
    }
    break;
  case WRONG_TYPE:
    if (format == FLAT_PACKED) {
      PVar3 = isPlausiblyPacked(this,prefix);
      if ((PVar3 & ~IMPLAUSIBLE) != WRONG_TYPE) goto LAB_0011ecd5;
      pPVar8 = this->context;
      pp_Var4 = pPVar8->_vptr_ProcessContext;
      pcVar7 = 
      "*** WARNING ***\nThe input data does not appear to match the schema that you specified. I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right schema. This could also be because the input is not in \"flat-packed\"\nformat; indeed, it looks like this input may be in regular packed format,\nso you might want to try \"packed\" instead.  Use --quiet to suppress this\nwarning.\n*** END WARNING ***\n"
      ;
      uVar5 = 0x1ae;
    }
    else if ((format == FLAT) &&
            (PVar3 = isPlausiblyBinary(this,prefix), (PVar3 & ~IMPLAUSIBLE) == WRONG_TYPE)) {
      pPVar8 = this->context;
      pp_Var4 = pPVar8->_vptr_ProcessContext;
      pcVar7 = 
      "*** WARNING ***\nThe input data does not appear to match the schema that you specified. I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right schema. This could also be because the input is not in \"flat\"\nformat; indeed, it looks like this input may be in regular binary format,\nso you might want to try \"binary\" instead.  Use --quiet to suppress this\nwarning.\n*** END WARNING ***\n"
      ;
      uVar5 = 0x1a7;
    }
    else {
LAB_0011ecd5:
      pPVar8 = this->context;
      pp_Var4 = pPVar8->_vptr_ProcessContext;
      pcVar7 = 
      "*** WARNING ***\nThe input data does not appear to be the type that you specified.  I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right type.  Use --quiet to suppress this warning.\n*** END WARNING ***\n"
      ;
      uVar5 = 0xf6;
    }
    (*pp_Var4[2])(pPVar8,pcVar7,uVar5);
    break;
  case PLAUSIBLE:
    break;
  default:
    kj::_::unreachable();
  }
switchD_0011e9eb_caseD_3:
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity checkPlausibility(Format format, kj::ArrayPtr<const byte> prefix) {
    switch (isPlausibly(format, prefix)) {
      case PLAUSIBLE:
        return true;

      case IMPOSSIBLE:
        KJ_IF_SOME(guess, guessFormat(prefix)) {
          return kj::str(
             "The input is not in \"", toString(format), "\" format. It looks like it is in \"",
             toString(guess), "\" format. Try that instead.");
        } else {
          return kj::str(
             "The input is not in \"", toString(format), "\" format.");
        }

      case IMPLAUSIBLE:
        KJ_IF_SOME(guess, guessFormat(prefix)) {
          context.warning(kj::str(
              "*** WARNING ***\n"
              "The input data does not appear to be in \"", toString(format), "\" format. It\n"
              "looks like it may be in \"", toString(guess), "\" format. I'll try to parse\n"
              "it in \"", toString(format), "\" format as you requested, but if it doesn't work,\n"
              "try \"", toString(format), "\" instead. Use --quiet to suppress this warning.\n"
              "*** END WARNING ***\n"));
        } else {
          context.warning(kj::str(
              "*** WARNING ***\n"
              "The input data does not appear to be in \"", toString(format), "\" format, nor\n"
              "in any other known format. I'll try to parse it in \"", toString(format), "\"\n"
              "format anyway, as you requested. Use --quiet to suppress this warning.\n"
              "*** END WARNING ***\n"));
        }